

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O0

int lj_cf_buffer_method_decode(lua_State *L)

{
  TValue *pTVar1;
  SBufExt *sbx_00;
  char *pcVar2;
  SBufExt *sbx;
  lua_State *L_local;
  SBufExt *sbx_1;
  
  sbx_00 = buffer_tobuf(L);
  (sbx_00->L).ptr64 = (ulong)L | (sbx_00->L).ptr64 & 7;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1->u64 = 0xffffffffffffffff;
  pcVar2 = lj_serialize_get(sbx_00,L->top + -1);
  sbx_00->r = pcVar2;
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_decode)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  setnilV(L->top++);
  sbx->r = lj_serialize_get(sbx, L->top-1);
  lj_gc_check(L);
  return 1;
}